

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ThreadSafeArena::AddCleanup
          (ThreadSafeArena *this,void *elem,_func_void_void_ptr *cleanup)

{
  bool bVar1;
  long *in_FS_OFFSET;
  SerialArena *arena;
  SerialArena *local_20;
  
  bVar1 = GetSerialArenaFast(this,&local_20);
  if (!bVar1) {
    local_20 = GetSerialArenaFallback(this,(void *)(*in_FS_OFFSET + -0x40));
  }
  SerialArena::AddCleanup
            (local_20,elem,cleanup,(AllocationPolicy *)(*(ulong *)(this + 8) & 0xfffffffffffffff8));
  return;
}

Assistant:

void ThreadSafeArena::AddCleanup(void* elem, void (*cleanup)(void*)) {
  SerialArena* arena;
  if (PROTOBUF_PREDICT_FALSE(!GetSerialArenaFast(&arena))) {
    arena = GetSerialArenaFallback(&thread_cache());
  }
  arena->AddCleanup(elem, cleanup, AllocPolicy());
}